

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::initializePipelineStack(QPDFWriter *this,Pipeline *p)

{
  size_t *psVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Count *__p;
  _List_node_base *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  __p = (Count *)operator_new(0x58);
  Pipeline::Pipeline((Pipeline *)__p,"",p);
  (__p->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002f2298;
  __p->count = 0;
  __p->str = (string *)0x0;
  (__p->link)._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
  __p->id_ = 1;
  __p->pass_immediately_to_next = p != (Pipeline *)0x0;
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->pipeline = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<qpdf::pl::Count*>(&_Stack_20,__p);
  p_Var4 = (_List_node_base *)operator_new(0x20);
  _Var3._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4[1]._M_next = (_List_node_base *)__p;
  p_Var4[1]._M_prev = (_List_node_base *)_Var3._M_pi;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = (size_t *)
           ((long)&(peVar2->to_delete).
                   super__List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar1 = *psVar1 + 1;
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<Pipeline*,std::allocator<Pipeline*>>::emplace_back<qpdf::pl::Count*&>
            ((vector<Pipeline*,std::allocator<Pipeline*>> *)&peVar2->pipeline_stack,
             &peVar2->pipeline);
  return;
}

Assistant:

void
QPDFWriter::initializePipelineStack(Pipeline* p)
{
    m->pipeline = new pl::Count(1, p);
    m->to_delete.emplace_back(std::shared_ptr<Pipeline>(m->pipeline));
    m->pipeline_stack.emplace_back(m->pipeline);
}